

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectrum.cpp
# Opt level: O0

PiecewiseLinearSpectrum *
pbrt::PiecewiseLinearSpectrum::FromInterleaved
          (span<const_float> samples,bool normalize,Allocator alloc)

{
  size_t sVar1;
  long lVar2;
  long lVar3;
  float *fmt;
  reference pvVar4;
  char (*args) [10];
  PiecewiseLinearSpectrum *pPVar5;
  byte in_DL;
  PiecewiseLinearSpectrum *spec;
  value_type vb_1;
  value_type va_1;
  size_t i;
  vector<float,_std::allocator<float>_> v;
  vector<float,_std::allocator<float>_> lambda;
  int n;
  size_t vb;
  int va;
  PiecewiseLinearSpectrum *in_stack_fffffffffffffec8;
  SpectrumHandle *in_stack_fffffffffffffed0;
  polymorphic_allocator<std::byte> *in_stack_fffffffffffffed8;
  allocator_type *in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee8;
  Float in_stack_fffffffffffffeec;
  PiecewiseLinearSpectrum *in_stack_fffffffffffffef0;
  undefined4 in_stack_ffffffffffffff18;
  float fVar6;
  undefined4 in_stack_ffffffffffffff1c;
  float fVar7;
  char (*in_stack_ffffffffffffff20) [2];
  char *in_stack_ffffffffffffff28;
  undefined8 in_stack_ffffffffffffff30;
  int line;
  char *in_stack_ffffffffffffff38;
  char *file;
  undefined8 in_stack_ffffffffffffff40;
  LogLevel level;
  char (*in_stack_ffffffffffffff50) [10];
  float *in_stack_ffffffffffffff58;
  char (*in_stack_ffffffffffffff60) [19];
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  value_type vVar8;
  ulong local_90;
  char local_81;
  vector<float,_std::allocator<float>_> local_80 [2];
  vector<float,_std::allocator<float>_> local_50;
  int local_34;
  ulong local_30;
  int local_28;
  byte local_21;
  span<const_float> local_18;
  
  level = (LogLevel)((ulong)in_stack_ffffffffffffff40 >> 0x20);
  line = (int)((ulong)in_stack_ffffffffffffff30 >> 0x20);
  local_21 = in_DL & 1;
  local_28 = 0;
  sVar1 = pstd::span<const_float>::size(&local_18);
  local_30 = sVar1 & 1;
  if ((long)local_28 != local_30) {
    LogFatal<char_const(&)[2],char_const(&)[19],char_const(&)[2],int&,char_const(&)[19],unsigned_long&>
              (level,in_stack_ffffffffffffff38,line,in_stack_ffffffffffffff28,
               in_stack_ffffffffffffff20,
               (char (*) [19])CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
               (char (*) [2])in_stack_ffffffffffffff50,(int *)in_stack_ffffffffffffff58,
               in_stack_ffffffffffffff60,
               (unsigned_long *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  }
  sVar1 = pstd::span<const_float>::size(&local_18);
  local_34 = (int)(sVar1 >> 1);
  lVar2 = (long)local_34;
  std::allocator<float>::allocator((allocator<float> *)0x8f7e90);
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffffef0,
             CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),in_stack_fffffffffffffee0
            );
  std::allocator<float>::~allocator((allocator<float> *)0x8f7eb9);
  lVar3 = (long)local_34;
  file = &local_81;
  std::allocator<float>::allocator((allocator<float> *)0x8f7ed8);
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffffef0,
             CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),in_stack_fffffffffffffee0
            );
  std::allocator<float>::~allocator((allocator<float> *)0x8f7efe);
  local_90 = 0;
  do {
    if ((ulong)(long)local_34 <= local_90) {
      pPVar5 = pstd::pmr::polymorphic_allocator<std::byte>::
               new_object<pbrt::PiecewiseLinearSpectrum,std::vector<float,std::allocator<float>>&,std::vector<float,std::allocator<float>>&,pstd::pmr::polymorphic_allocator<std::byte>&>
                         ((polymorphic_allocator<std::byte> *)in_stack_fffffffffffffef0,
                          (vector<float,_std::allocator<float>_> *)
                          CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
                          (vector<float,_std::allocator<float>_> *)in_stack_fffffffffffffee0,
                          in_stack_fffffffffffffed8);
      if ((local_21 & 1) != 0) {
        SpectrumHandle::TaggedPointer<pbrt::PiecewiseLinearSpectrum>
                  (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
        Spectra::Y();
        SpectrumHandle::TaggedPointer<pbrt::DenselySampledSpectrum_const>
                  (in_stack_fffffffffffffed0,(DenselySampledSpectrum *)in_stack_fffffffffffffec8);
        InnerProduct((SpectrumHandle *)in_stack_fffffffffffffef0,
                     (SpectrumHandle *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8)
                    );
        Scale(in_stack_fffffffffffffef0,in_stack_fffffffffffffeec);
      }
      std::vector<float,_std::allocator<float>_>::~vector
                ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffffee0);
      std::vector<float,_std::allocator<float>_>::~vector
                ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffffee0);
      return pPVar5;
    }
    fmt = pstd::span<const_float>::operator[](&local_18,local_90 * 2);
    fVar7 = *fmt;
    pvVar4 = std::vector<float,_std::allocator<float>_>::operator[](&local_50,local_90);
    *pvVar4 = fVar7;
    args = (char (*) [10])pstd::span<const_float>::operator[](&local_18,local_90 * 2 + 1);
    fVar6 = *(float *)*args;
    pvVar4 = std::vector<float,_std::allocator<float>_>::operator[](local_80,local_90);
    *pvVar4 = fVar6;
    if (local_90 != 0) {
      pvVar4 = std::vector<float,_std::allocator<float>_>::operator[](&local_50,local_90);
      vVar8 = *pvVar4;
      pvVar4 = std::vector<float,_std::allocator<float>_>::operator[](&local_50,local_90 - 1);
      if (vVar8 <= *pvVar4) {
        LogFatal<char_const(&)[10],char_const(&)[14],char_const(&)[10],float&,char_const(&)[14],float&>
                  ((LogLevel)((ulong)lVar2 >> 0x20),file,(int)((ulong)lVar3 >> 0x20),(char *)fmt,
                   args,(char (*) [14])CONCAT44(fVar7,fVar6),in_stack_ffffffffffffff50,
                   in_stack_ffffffffffffff58,(char (*) [14])in_stack_ffffffffffffff60,
                   (float *)CONCAT44(vVar8,*pvVar4));
      }
    }
    local_90 = local_90 + 1;
  } while( true );
}

Assistant:

PiecewiseLinearSpectrum *PiecewiseLinearSpectrum::FromInterleaved(
    pstd::span<const Float> samples, bool normalize, Allocator alloc) {
    CHECK_EQ(0, samples.size() % 2);
    int n = samples.size() / 2;
    std::vector<Float> lambda(n), v(n);
    for (size_t i = 0; i < n; ++i) {
        lambda[i] = samples[2 * i];
        v[i] = samples[2 * i + 1];
        if (i > 0)
            CHECK_GT(lambda[i], lambda[i - 1]);
    }

    PiecewiseLinearSpectrum *spec =
        alloc.new_object<pbrt::PiecewiseLinearSpectrum>(lambda, v, alloc);

    if (normalize)
        // Normalize to have luminance of 1.
        spec->Scale(1 / InnerProduct(spec, &Spectra::Y()));

    return spec;
}